

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

uint32_t __thiscall
cubeb_resampler_speex_one_way<float>::latency(cubeb_resampler_speex_one_way<float> *this)

{
  int iVar1;
  long in_RDI;
  int latency;
  
  iVar1 = speex_resampler_get_output_latency(*(SpeexResamplerState **)(in_RDI + 0x10));
  return iVar1 + *(int *)(in_RDI + 0x50);
}

Assistant:

uint32_t latency() const
  {
    /* The documentation of the resampler talks about "samples" here, but it
     * only consider a single channel here so it's the same number of frames. */
    int latency = 0;

    latency = speex_resampler_get_output_latency(speex_resampler) +
              additional_latency;

    assert(latency >= 0);

    return latency;
  }